

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

bool deqp::gles3::Functional::anon_unknown_0::compareColoredPixels(IVec4 *a,IVec4 *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  tcu local_5c [4];
  Vector<int,_4> local_58;
  tcu local_40 [16];
  tcu local_30 [16];
  
  bVar1 = isBlack(a);
  bVar2 = isBlack(b);
  local_58.m_data[0] = 0x14;
  local_58.m_data[1] = 0x14;
  local_58.m_data[2] = 0x14;
  local_58.m_data[3] = 0;
  bVar3 = true;
  if (!bVar1 || !bVar2) {
    if (bVar1 == bVar2) {
      tcu::operator-(local_40,a,b);
      tcu::abs<int,4>(local_30,(Vector<int,_4> *)local_40);
      tcu::lessThanEqual<int,4>(local_5c,(Vector<int,_4> *)local_30,&local_58);
      bVar3 = tcu::boolAll<4>((Vector<bool,_4> *)local_5c);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

inline bool compareColoredPixels (const tcu::IVec4& a, const tcu::IVec4& b)
{
	const bool aIsBlack = isBlack(a);
	const bool bIsBlack = isBlack(b);
	const tcu::IVec4 threshold(20, 20, 20, 0);

	if (aIsBlack && bIsBlack)
		return true;
	if (aIsBlack != bIsBlack)
		return false;

	return tcu::boolAll(tcu::lessThanEqual(tcu::abs(a - b), threshold));
}